

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void VisitList<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
               (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,
               ParseNodeVisitor<SymCheck> prefix,ParseNodeVisitor<SymCheck> postfix)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodeBin *pPVar4;
  ParseNode *pnode1;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pnode_local;
  ParseNodeVisitor<SymCheck> postfix_local;
  ParseNodeVisitor<SymCheck> prefix_local;
  
  if (pnode == (ParseNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x3c,"(pnode != nullptr)","pnode != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  byteCodeGenerator_local = (ByteCodeGenerator *)pnode;
  if (pnode->nop != knopList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x3d,"(pnode->nop == knopList)","pnode->nop == knopList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  do {
    pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar4->pnode1,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0);
    pPVar4 = ParseNode::AsParseNodeBin((ParseNode *)byteCodeGenerator_local);
    byteCodeGenerator_local = (ByteCodeGenerator *)pPVar4->pnode2;
  } while (*(OpCode *)&byteCodeGenerator_local->scriptContext == knopList);
  Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
            ((ParseNode *)byteCodeGenerator_local,byteCodeGenerator,prefix,postfix,(ParseNode *)0x0)
  ;
  return;
}

Assistant:

void VisitList(ParseNode *pnode, ByteCodeGenerator* byteCodeGenerator, PrefixFn prefix, PostfixFn postfix)
{
    Assert(pnode != nullptr);
    Assert(pnode->nop == knopList);

    do
    {
        ParseNode * pnode1 = pnode->AsParseNodeBin()->pnode1;
        Visit(pnode1, byteCodeGenerator, prefix, postfix);
        pnode = pnode->AsParseNodeBin()->pnode2;
    }
    while (pnode->nop == knopList);
    Visit(pnode, byteCodeGenerator, prefix, postfix);
}